

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_23::OptionsToInterpret::~OptionsToInterpret(OptionsToInterpret *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->element_path).super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&this->element_name);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

OptionsToInterpret(absl::string_view ns, absl::string_view el,
                     absl::Span<const int> path, const Message* orig_opt,
                     Message* opt)
      : name_scope(ns),
        element_name(el),
        element_path(path.begin(), path.end()),
        original_options(orig_opt),
        options(opt) {}